

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::Cord::SetExpectedChecksum(Cord *this,uint32_t crc)

{
  Rep *pRVar1;
  size_t length_arg;
  CrcCordState local_50;
  crc32c_t local_44;
  PrefixCrc local_40 [2];
  CrcCordState local_20;
  CrcCordState state;
  uint32_t crc_local;
  Cord *this_local;
  
  state.refcounted_rep_._4_4_ = crc;
  crc_internal::CrcCordState::CrcCordState(&local_20);
  pRVar1 = crc_internal::CrcCordState::mutable_rep(&local_20);
  length_arg = size(this);
  crc32c_t::crc32c_t(&local_44,state.refcounted_rep_._4_4_);
  crc_internal::CrcCordState::PrefixCrc::PrefixCrc(local_40,length_arg,local_44);
  std::
  deque<absl::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::crc_internal::CrcCordState::PrefixCrc>_>
  ::push_back(&pRVar1->prefix_crc,local_40);
  crc_internal::CrcCordState::CrcCordState(&local_50,&local_20);
  SetCrcCordState(this,&local_50);
  crc_internal::CrcCordState::~CrcCordState(&local_50);
  crc_internal::CrcCordState::~CrcCordState(&local_20);
  return;
}

Assistant:

void Cord::SetExpectedChecksum(uint32_t crc) {
  // Construct a CrcCordState with a single chunk.
  crc_internal::CrcCordState state;
  state.mutable_rep()->prefix_crc.push_back(
      crc_internal::CrcCordState::PrefixCrc(size(), absl::crc32c_t{crc}));
  SetCrcCordState(std::move(state));
}